

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O0

void __thiscall
HttpdBufferedReader_StringCRNoLFChars_Test::~HttpdBufferedReader_StringCRNoLFChars_Test
          (HttpdBufferedReader_StringCRNoLFChars_Test *this)

{
  HttpdBufferedReader_StringCRNoLFChars_Test *this_local;
  
  ~HttpdBufferedReader_StringCRNoLFChars_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (HttpdBufferedReader, StringCRNoLFChars) {
    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("abc\rdef")));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        gets_result_type const s1 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s1))
            << "There was an unexpected error: " << s1.get_error ();
        maybe<std::string> str1;
        std::tie (io, str1) = *s1;
        ASSERT_TRUE (str1.has_value ());
        EXPECT_EQ (str1.value (), "abc");
    }
    {
        gets_result_type const s2 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s2))
            << "There was an unexpected error: " << s2.get_error ();
        maybe<std::string> str2;
        std::tie (io, str2) = *s2;
        ASSERT_TRUE (str2.has_value ());
        EXPECT_EQ (str2.value (), "def");
    }
}